

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

Vec_Int_t *
Acb_NtkCollectWindow(Acb_Ntk_t *p,int Pivot,Vec_Int_t *vTfi,Vec_Int_t *vTfo,Vec_Int_t *vRoots)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  long lVar7;
  
  p_00 = Vec_IntAlloc(100);
  iVar3 = Vec_IntEntryLast(vTfi);
  if (iVar3 != Pivot) {
    __assert_fail("Vec_IntEntryLast(vTfi) == Pivot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x2ef,
                  "Vec_Int_t *Acb_NtkCollectWindow(Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Acb_NtkIncTravId(p);
  for (iVar3 = 0; iVar4 = vTfi->nSize, iVar3 < iVar4; iVar3 = iVar3 + 1) {
    iVar4 = Vec_IntEntry(vTfi,iVar3);
    Acb_ObjSetTravIdCur(p,iVar4);
  }
  for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
    iVar4 = Vec_IntEntry(vTfi,iVar3);
    piVar6 = Acb_ObjFanins(p,iVar4);
    lVar7 = 0;
    bVar1 = false;
    while (lVar7 < *piVar6) {
      lVar2 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      iVar5 = Acb_ObjIsTravIdCur(p,piVar6[lVar2]);
      if (iVar5 == 0) {
        bVar1 = true;
      }
    }
    iVar5 = Acb_ObjIsCi(p,iVar4);
    iVar4 = Abc_Var2Lit(iVar4,(uint)(iVar5 != 0 || bVar1));
    Vec_IntPush(p_00,iVar4);
    iVar4 = vTfi->nSize;
  }
  Acb_NtkIncTravId(p);
  for (iVar3 = 0; iVar3 < vRoots->nSize; iVar3 = iVar3 + 1) {
    iVar4 = Vec_IntEntry(vRoots,iVar3);
    Acb_ObjSetTravIdCur(p,iVar4);
  }
  iVar3 = 0;
  while( true ) {
    if (vTfo->nSize <= iVar3) {
      return p_00;
    }
    iVar4 = Vec_IntEntry(vTfo,iVar3);
    iVar5 = Acb_ObjIsCo(p,iVar4);
    if (iVar5 != 0) break;
    iVar5 = Acb_ObjIsTravIdCur(p,iVar4);
    iVar4 = Abc_Var2Lit(iVar4,iVar5);
    Vec_IntPush(p_00,iVar4);
    iVar3 = iVar3 + 1;
  }
  __assert_fail("!Acb_ObjIsCo(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                ,0x304,
                "Vec_Int_t *Acb_NtkCollectWindow(Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Int_t * Acb_NtkCollectWindow( Acb_Ntk_t * p, int Pivot, Vec_Int_t * vTfi, Vec_Int_t * vTfo, Vec_Int_t * vRoots )
{
    Vec_Int_t * vWin = Vec_IntAlloc( 100 );
    int i, k, iObj, iFanin, * pFanins;
    assert( Vec_IntEntryLast(vTfi) == Pivot );
    // mark nodes
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vTfi, iObj, i )
        Acb_ObjSetTravIdCur(p, iObj);
    // add TFI
    Vec_IntForEachEntry( vTfi, iObj, i )
    {
        int fIsTfiInput = 0;
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            if ( !Acb_ObjIsTravIdCur(p, iFanin) ) // fanin is not in TFI
                fIsTfiInput = 1; // mark as leaf
        Vec_IntPush( vWin, Abc_Var2Lit(iObj, Acb_ObjIsCi(p, iObj) || fIsTfiInput) );
    }
    // mark roots
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vRoots, iObj, i )
        Acb_ObjSetTravIdCur(p, iObj);
    // add TFO
    Vec_IntForEachEntry( vTfo, iObj, i )
    {
        assert( !Acb_ObjIsCo(p, iObj) );
        Vec_IntPush( vWin, Abc_Var2Lit(iObj, Acb_ObjIsTravIdCur(p, iObj)) );
    }
    return vWin;
}